

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

vector_t * __thiscall
cfg::tag_vector_t<cfgfile::qstring_trait_t>::get_cfg(tag_vector_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *this_00;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  size_t i;
  vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> vector__;
  vector_t *c;
  value_type *in_stack_fffffffffffffe98;
  tag_tags_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffea0;
  tag_t<cfgfile::qstring_trait_t> *this_01;
  tag_tags_t<cfgfile::qstring_trait_t> *in_stack_ffffffffffffff98;
  vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *local_48;
  
  this_01 = in_RDI;
  vector_t::vector_t((vector_t *)0x12955e);
  bVar1 = cfgfile::tag_t<cfgfile::qstring_trait_t>::is_defined(this_01);
  if (bVar1) {
    std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::vector
              ((vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *)0x12958c);
    for (local_48 = (vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *)0x0;
        this_00 = (vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *)
                  cfgfile::
                  tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_cfgfile::qstring_trait_t>
                  ::size((tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_cfgfile::qstring_trait_t>
                          *)0x1295b3), local_48 < this_00;
        local_48 = (vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *)
                   ((long)&(local_48->super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 1)) {
      in_stack_fffffffffffffea0 =
           cfgfile::
           tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_cfgfile::qstring_trait_t>
           ::at((tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_cfgfile::qstring_trait_t>
                 *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
      tag_tags_t<cfgfile::qstring_trait_t>::get_cfg(in_stack_ffffffffffffff98);
      std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::push_back
                ((vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98);
      tags_t::~tags_t((tags_t *)in_stack_fffffffffffffea0);
    }
    vector_t::set_vector
              ((vector_t *)in_stack_fffffffffffffea0,
               (vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> *)in_stack_fffffffffffffe98);
    std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::~vector(this_00);
  }
  return (vector_t *)in_RDI;
}

Assistant:

vector_t get_cfg() const
	{
		vector_t c;

		if( m_vector.is_defined() )
		{
			std::vector< cfg::tags_t > vector__;

			for( std::size_t i = 0; i < m_vector.size(); ++i )
				vector__.push_back( m_vector.at( i ).get_cfg() );

			c.set_vector( vector__ );
		}

		return c;
	}